

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fms.c
# Opt level: O1

int FmsComponentCompare(FmsComponent lhs,FmsComponent rhs)

{
  FmsIntType itype;
  char *__s1;
  FmsInt FVar1;
  _FmsPart_private *p_Var2;
  _FmsPart_private *p_Var3;
  FmsInt *pFVar4;
  FmsInt *pFVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  FmsInt FVar9;
  FmsInt FVar10;
  long lVar11;
  _FmsPart_private *p_Var12;
  _FmsPart_private *p_Var13;
  FmsInt FVar14;
  uint uVar15;
  bool bVar16;
  
  if (lhs == rhs) {
    uVar15 = 0;
  }
  else if (lhs == (FmsComponent)0x0) {
    uVar15 = 0xffffffff;
  }
  else if (rhs == (FmsComponent)0x0) {
    uVar15 = 0xfffffffe;
  }
  else {
    __s1 = lhs->name;
    uVar15 = 2;
    if (__s1 != (char *)0x0) {
      if (rhs->name == (char *)0x0) {
        if (__s1 != (char *)0x0) {
          uVar15 = (uint)(rhs->name == (char *)0x0) * 3;
        }
      }
      else {
        iVar7 = strcmp(__s1,rhs->name);
        uVar15 = (uint)(iVar7 != 0);
      }
    }
    uVar6 = uVar15 + 10;
    if (lhs->id == rhs->id) {
      uVar6 = uVar15;
    }
    uVar15 = uVar6 + 100;
    if (lhs->dim == rhs->dim) {
      uVar15 = uVar6;
    }
    uVar6 = uVar15 + 1000;
    if (lhs->num_main_entities == rhs->num_main_entities) {
      uVar6 = uVar15;
    }
    FVar10 = lhs->num_parts;
    uVar8 = uVar6 + 2000;
    if (FVar10 == rhs->num_parts) {
      uVar8 = uVar6;
    }
    FVar1 = lhs->num_relations;
    uVar15 = uVar8 + 3000;
    if (FVar1 == rhs->num_relations) {
      uVar15 = uVar8;
    }
    if (uVar15 == 0) {
      if (FVar10 == 0) {
        uVar15 = 0;
      }
      else {
        p_Var2 = lhs->parts;
        p_Var3 = rhs->parts;
        uVar15 = 0;
        FVar14 = 0;
        p_Var12 = p_Var2;
        p_Var13 = p_Var3;
        do {
          iVar7 = FmsDomainCompare(p_Var2[FVar14].domain,p_Var3[FVar14].domain);
          if (iVar7 == 0) {
            lVar11 = 0;
            do {
              FVar9 = *(FmsInt *)((long)p_Var12->num_entities + lVar11 * 2);
              if (FVar9 != *(FmsInt *)((long)p_Var13->num_entities + lVar11 * 2)) {
                uVar15 = uVar15 + 20000;
                break;
              }
              itype = *(FmsIntType *)((long)p_Var12->entities_ids_type + lVar11);
              if (itype != *(FmsIntType *)((long)p_Var13->entities_ids_type + lVar11)) {
                uVar15 = uVar15 + 30000;
                break;
              }
              FVar9 = CompareIntData(itype,FVar9,
                                     *(void **)((long)p_Var12->entities_ids + lVar11 * 2),
                                     *(void **)((long)p_Var13->entities_ids + lVar11 * 2));
              if (FVar9 != 0) {
                uVar15 = uVar15 + 40000;
                break;
              }
              lVar11 = lVar11 + 4;
            } while (lVar11 != 0x20);
            bVar16 = uVar15 != 0;
          }
          else {
            uVar15 = uVar15 + 10000;
            bVar16 = true;
          }
          if (bVar16) break;
          FVar14 = FVar14 + 1;
          p_Var13 = p_Var13 + 1;
          p_Var12 = p_Var12 + 1;
        } while (FVar14 != FVar10);
      }
    }
    if (uVar15 == 0) {
      pFVar4 = lhs->relations;
      pFVar5 = rhs->relations;
      uVar15 = 0;
      if (((pFVar4 != pFVar5) &&
          (uVar15 = 50000, pFVar5 != (FmsInt *)0x0 && pFVar4 != (FmsInt *)0x0)) &&
         (uVar15 = 0, FVar1 != 0)) {
        FVar10 = 0;
        do {
          if (pFVar4[FVar10] != pFVar5[FVar10]) {
            uVar15 = 50000;
            if (FVar10 == 0xffffffffffffffff) {
              uVar15 = 0;
            }
            goto LAB_0010b1a4;
          }
          FVar10 = FVar10 + 1;
        } while (FVar1 != FVar10);
        uVar15 = 0;
      }
    }
LAB_0010b1a4:
    if (uVar15 == 0) {
      iVar7 = FmsFieldCompare(lhs->coordinates,rhs->coordinates);
      uVar15 = 60000;
      if (iVar7 == 0) {
        uVar15 = 0;
      }
    }
  }
  return uVar15;
}

Assistant:

int FmsComponentCompare(FmsComponent lhs, FmsComponent rhs) {
  if(lhs == rhs) return 0;
  if(!lhs) return -1;
  if(!rhs) return -2;
  int diff = 0;

  if(lhs->name && rhs->name) {
    if(strcmp(lhs->name, rhs->name))
      diff += 1;
  } else if(!lhs->name)
    diff += 2;
  else if(!rhs->name)
    diff += 3;

  if(lhs->id != rhs->id)
    diff += 10;

  if(lhs->dim != rhs->dim)
    diff += 100;

  if(lhs->num_main_entities != rhs->num_main_entities)
    diff += 1000;

  if(lhs->num_parts != rhs->num_parts)
    diff += 2000;

  if(lhs->num_relations != rhs->num_relations)
    diff += 3000;

  if(diff == 0) {
    const FmsInt np = lhs->num_parts;
    for(FmsInt i = 0; i < np; i++) {
      const struct _FmsPart_private *lpart = &lhs->parts[i];
      const struct _FmsPart_private *rpart = &rhs->parts[i];
      if(FmsDomainCompare(lpart->domain, rpart->domain)) {
        diff += 10000;
        break;
      }
      for(FmsInt j = 0; j < FMS_NUM_ENTITY_TYPES; j++) {
        if(lpart->num_entities[j] != rpart->num_entities[j]) {
          diff += 20000;
          break;
        }
        if(lpart->entities_ids_type[j] != rpart->entities_ids_type[j]) {
          diff += 30000;
          break;
        }
        if(CompareIntData(lpart->entities_ids_type[j],
                          lpart->num_entities[j],
                          lpart->entities_ids[j], rpart->entities_ids[j])) {
          diff += 40000;
          break;
        }
      }
      if(diff)
        break;
    }
  }

  if(diff == 0) {
    if(CompareIntData(FMS_INT_TYPE, lhs->num_relations, lhs->relations,
                      rhs->relations))
      diff += 50000;
  }

  if(diff == 0) {
    // Ensure they refer to the same coordinates field
    if(FmsFieldCompare(lhs->coordinates, rhs->coordinates))
      diff += 60000;
  }

  return diff;
}